

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O0

void __thiscall InputGraph::set_vertex_name(InputGraph *this,int v,string_view l)

{
  string_view name;
  pointer pIVar1;
  undefined8 in_RDI;
  char *in_stack_000000a0;
  undefined4 in_stack_000000a8;
  param_type l_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  associative_container_adaptor<_73302351_> *in_stack_ffffffffffffff50;
  allocator<char> *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  container_adaptor<_f3d529dc_> *in_stack_ffffffffffffff88;
  
  l_00 = (param_type)((ulong)in_RDI >> 0x20);
  name._M_len._4_4_ = v;
  name._M_len._0_4_ = in_stack_000000a8;
  name._M_str = (char *)this;
  anon_unknown.dwarf_35aab::sanity_check_name(name,in_stack_000000a0);
  std::unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>::operator->
            ((unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)0x111d59);
  boost::bimaps::container_adaptor::associative_container_adaptor<$73302351$>::erase<int>
            (in_stack_ffffffffffffff50,
             (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pIVar1 = std::unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>::operator->
                     ((unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)0x111d79
                     );
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &pIVar1->vertex_names;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  boost::bimaps::relation::
  mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
  ::mutant_relation((mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
                     *)this_00,l_00,(param_type)0x111dc8);
  boost::bimaps::container_adaptor::container_adaptor<$f3d529dc$>::insert
            (in_stack_ffffffffffffff88,(param_type)in_stack_ffffffffffffff80);
  boost::bimaps::relation::
  mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
  ::~mutant_relation((mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
                      *)0x111dea);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  return;
}

Assistant:

auto InputGraph::set_vertex_name(int v, string_view l) -> void
{
    sanity_check_name(l, "vertex name");
    _imp->vertex_names.left.erase(v);
    _imp->vertex_names.insert(Names::value_type{v, string{l}});
}